

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O0

void __thiscall FIX::FileStore::refresh(FileStore *this)

{
  int __oflag;
  exception *e;
  UtcTimeStamp local_28;
  FileStore *local_10;
  FileStore *this_local;
  
  local_10 = this;
  UtcTimeStamp::now();
  MemoryStore::reset(&this->m_cache,&local_28);
  UtcTimeStamp::~UtcTimeStamp(&local_28);
  std::
  map<unsigned_long,_std::pair<long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>_>
  ::clear(&this->m_offsets);
  open(this,(char *)0x0,__oflag);
  return;
}

Assistant:

EXCEPT(IOException) {
  try {
    m_cache.reset(UtcTimeStamp::now());
    m_offsets.clear();
    open(false);
  } catch (std::exception &e) {
    throw IOException(e.what());
  }
}